

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O3

_Bool x86_cpu_tlb_fill_x86_64
                (CPUState *cs,vaddr addr,int size,MMUAccessType access_type,int mmu_idx,_Bool probe,
                uintptr_t retaddr)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  TranslationBlock *pTVar7;
  uint64_t uVar8;
  ulong uVar9;
  hwaddr hVar10;
  byte bVar11;
  uint32_t uVar12;
  uint64_t uVar13;
  int iVar14;
  ulong uVar15;
  undefined7 in_register_00000089;
  int error_code;
  uint64_t uVar16;
  TranslationBlock *pTVar17;
  uint uVar18;
  int local_70;
  uint local_68;
  MMUAccessType local_64;
  TranslationBlock *local_60;
  int local_54;
  hwaddr local_50;
  ulong local_48;
  ulong local_40;
  undefined4 local_34;
  
  cs[1].tb_jmp_cache[0x39e] = (TranslationBlock *)retaddr;
  uVar5 = *(uint *)(cs[1].tb_jmp_cache + 0x101);
  uVar15 = 0xffffffffffffffff;
  if ((uVar5 >> 0x13 & 1) == 0) {
    uVar15 = (ulong)*(int *)(cs[1].tb_jmp_cache + 0x125);
  }
  local_54 = mmu_idx;
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x903) & 0x80) == 0) {
    uVar9 = addr & 0xffffffff;
    if ((uVar5 >> 0xe & 1) != 0) {
      uVar9 = addr;
    }
    local_68 = 7;
    bVar11 = (byte)access_type;
    uVar5 = 0x1000;
    goto LAB_00507a95;
  }
  local_40 = (ulong)(access_type & MMU_DATA_STORE);
  local_34 = (undefined4)CONCAT71(in_register_00000089,probe);
  local_64 = access_type;
  local_60 = (TranslationBlock *)addr;
  local_48 = uVar15;
  if (((ulong)cs[1].tb_jmp_cache[0x124] & 0x20) == 0) {
    local_70 = 0;
    local_50 = get_hphys(cs,((ulong)cs[1].tb_jmp_cache[0x123] & 0xfffffffffffff000) +
                            (addr >> 0x16 & 0x3ff) * 4 & uVar15,MMU_DATA_STORE,(int *)0x0);
    uVar4 = x86_ldl_phys_x86_64(cs,local_50);
    if ((uVar4 & 1) == 0) goto LAB_00507b5f;
    if ((-1 < (char)uVar4) || (((ulong)cs[1].tb_jmp_cache[0x124] & 0x10) == 0)) {
      uVar12 = uVar4;
      if ((uVar4 & 0x20) == 0) {
        uVar12 = uVar4 | 0x20;
        x86_stl_phys_notdirty_x86_64(cs,local_50,uVar12);
      }
      local_70 = 0;
      local_50 = get_hphys(cs,(ulong)((uint)local_48 &
                                     ((uint)((ulong)local_60 >> 10) & 0xffc | uVar12 & 0xfffff000)),
                           MMU_DATA_STORE,(int *)0x0);
      uVar12 = x86_ldl_phys_x86_64(cs,local_50);
      uVar16 = (uint64_t)uVar12;
      if ((uVar12 & 1) != 0) {
        uVar15 = (ulong)(uVar4 & uVar12) | 0x8000000000000000;
        uVar5 = 0x1000;
        uVar9 = 0;
        goto LAB_005078fa;
      }
      goto LAB_00507b5f;
    }
    uVar16 = (ulong)(uVar4 & 0x1fe000) << 0x13 | (ulong)uVar4;
    uVar15 = (ulong)uVar4 | 0x8000000000000000;
    uVar5 = 0x400000;
    uVar9 = 0x200000;
LAB_00507906:
    if ((uVar16 & uVar9) != 0) goto LAB_00507b2f;
    if ((local_54 == 1) && ((uVar15 & 4) == 0)) {
      local_70 = 1;
      goto LAB_00507b5f;
    }
    local_68 = 0;
    if ((local_54 == 0) && (uVar18 = 0, (uVar15 & 4) != 0)) {
LAB_0050797a:
      if ((long)uVar15 < 0) {
        if (local_54 != 1) {
LAB_00507985:
          if (((*(byte *)((long)cs[1].tb_jmp_cache + 0x922) & 0x10) != 0) && ((uVar15 & 4) != 0))
          goto LAB_0050799f;
        }
LAB_00507996:
        uVar18 = uVar18 | 4;
        local_68 = uVar18;
      }
    }
    else {
      local_68 = 1;
      if ((uVar15 & 2) != 0) {
LAB_0050796c:
        local_68 = 3;
        uVar18 = 3;
        goto LAB_0050797a;
      }
      if (local_54 != 1) {
        if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x902) & 1) == 0) goto LAB_0050796c;
        uVar18 = 1;
        if (-1 < (long)uVar15) goto LAB_0050799f;
        goto LAB_00507985;
      }
      uVar18 = 1;
      if ((long)uVar15 < 0) goto LAB_00507996;
    }
LAB_0050799f:
    if (((((*(byte *)((long)cs[1].tb_jmp_cache + 0x922) & 0x40) == 0) ||
         ((*(byte *)((long)cs[1].tb_jmp_cache + 0x809) & 0x40) == 0)) || ((uVar15 & 4) == 0)) ||
       (uVar1 = *(uint *)(cs[1].tb_jmp_cache + 0x37e), uVar1 == 0)) {
LAB_00507a12:
      local_70 = 1;
      bVar11 = (byte)local_64;
      if ((uVar18 >> (local_64 & 0x1f) & 1) != 0) {
        bVar3 = (uVar16 & 0x40) == 0 & (byte)local_40;
        uVar9 = uVar16;
        if (((byte)((uVar16 & 0xffffffff) >> 5) & 7 & (bVar3 ^ 1)) == 0) {
          uVar15 = (ulong)bVar3 << 6;
          uVar9 = uVar15 | uVar16 | 0x20;
          x86_stl_phys_notdirty_x86_64(cs,local_50,(uint)uVar15 | (uint)uVar16 | 0x20);
        }
        addr = (vaddr)local_60;
        uVar15 = local_48;
        access_type = local_64;
        if ((uVar9 & 0x40) == 0) {
          if ((int)local_40 != 0) {
            __assert_fail("!is_write",
                          "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/excp_helper.c"
                          ,0x273,"int handle_mmu_fault(CPUState *, vaddr, int, int, int)");
          }
          local_68 = uVar18 & 0xfffffffd;
        }
LAB_00507a95:
        hVar10 = get_hphys(cs,(ulong)((uint)addr & uVar5 - 1) +
                              (uVar15 & 0xffffffffff000 & (long)(int)-uVar5 & uVar9),access_type,
                           (int *)&local_68);
        if ((local_68 & 1 << (bVar11 & 0x1f)) == 0) {
          __assert_fail("prot & (1 << is_write1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/excp_helper.c"
                        ,0x284,"int handle_mmu_fault(CPUState *, vaddr, int, int, int)");
        }
        tlb_set_page_with_attrs_x86_64
                  (cs,addr & 0xfffffffffffff000,hVar10 & 0xfffffffffffff000,
                   (MemTxAttrs)(*(uint *)(cs[1].tb_jmp_cache + 0x101) >> 0x12 & 2),local_68,local_54
                   ,(ulong)uVar5);
        return true;
      }
      goto LAB_00507b5f;
    }
    uVar6 = 4;
    if ((((uVar1 >> ((uint)(uVar16 >> 0x3a) & 0x1e) & 1) == 0) &&
        (uVar6 = 7, (uVar1 >> ((byte)(uVar16 >> 0x3a) & 0x1e) & 2) != 0)) &&
       ((local_54 == 1 || ((*(byte *)((long)cs[1].tb_jmp_cache + 0x902) & 1) != 0)))) {
      uVar6 = 5;
    }
    uVar18 = uVar18 & uVar6;
    local_68 = uVar18;
    if ((uVar6 >> (local_64 & 0x1f) & 1) != 0) goto LAB_00507a12;
    if (local_64 == MMU_INST_FETCH) {
      __assert_fail("is_write1 != 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/excp_helper.c"
                    ,0x25c,"int handle_mmu_fault(CPUState *, vaddr, int, int, int)");
    }
    error_code = (int)local_40 * 2 + (uint)(local_54 == 1) * 4 + 0x21;
  }
  else {
    uVar9 = ((ulong)(*(byte *)((long)cs[1].tb_jmp_cache + 0x989) >> 3) << 0x3f) + 0x800fff0000000000
    ;
    if ((uVar5 >> 0xe & 1) == 0) {
      local_70 = 0;
      hVar10 = get_hphys(cs,((ulong)cs[1].tb_jmp_cache[0x123] & 0xffffffffffffffe0) +
                            (addr >> 0x1e & 3) * 8 & uVar15,MMU_DATA_STORE,(int *)0x0);
      uVar16 = x86_ldq_phys_x86_64(cs,hVar10);
      if ((uVar16 & 1) != 0) {
        if (uVar16 >> 0x28 == 0) {
          uVar9 = uVar9 | 0x7ff0000000000000;
          uVar15 = 0x8000000000000006;
LAB_005077d5:
          local_70 = 0;
          local_50 = get_hphys(cs,((ulong)((uint)((ulong)local_60 >> 0x12) & 0xff8) |
                                  uVar16 & 0xffffffffff000) & local_48,MMU_DATA_STORE,(int *)0x0);
          uVar16 = x86_ldq_phys_x86_64(cs,local_50);
          uVar2 = local_48;
          if ((uVar16 & 1) == 0) goto LAB_00507b5f;
          if ((uVar16 & uVar9) == 0) {
            uVar15 = (uVar16 ^ 0x8000000000000000) & uVar15;
            uVar5 = 0x200000;
            if (-1 < (char)uVar16) {
              if ((uVar16 & 0x20) == 0) {
                x86_stl_phys_notdirty_x86_64(cs,local_50,(uint)uVar16 | 0x20);
              }
              local_70 = 0;
              local_50 = get_hphys(cs,((ulong)((uint)((ulong)local_60 >> 9) & 0xff8) |
                                      uVar16 & 0xffffffffff000) & uVar2,MMU_DATA_STORE,(int *)0x0);
              uVar16 = x86_ldq_phys_x86_64(cs,local_50);
              if (((uVar16 & 1) == 0) || (local_70 = 9, (uVar16 & uVar9) != 0)) goto LAB_00507b5f;
              uVar15 = uVar15 & (uVar16 ^ 0x8000000000000000);
              uVar5 = 0x1000;
            }
LAB_005078fa:
            uVar9 = uVar5 - 1 & 0x7fffe000 | uVar9;
            goto LAB_00507906;
          }
        }
LAB_00507b2f:
        local_70 = 9;
      }
    }
    else {
      uVar5 = (uint)cs[1].tb_jmp_cache[0x124];
      if (((long)addr >> (((uVar5 >> 0xc & 1) != 0) * '\t' + 0x2fU & 0x3f)) - 1U <
          0xfffffffffffffffe) {
        iVar14 = 0xd;
        error_code = 0;
        goto LAB_00507bdd;
      }
      pTVar17 = cs[1].tb_jmp_cache[0x123];
      if ((uVar5 >> 0xc & 1) == 0) {
        uVar15 = 0x8000000000000006;
      }
      else {
        local_70 = 0;
        hVar10 = get_hphys(cs,((ulong)((uint)(addr >> 0x2d) & 0xff8) |
                              (ulong)pTVar17 & 0xfffffffffffff000) & uVar15,MMU_DATA_STORE,
                           (int *)0x0);
        pTVar7 = (TranslationBlock *)x86_ldq_phys_x86_64(cs,hVar10);
        if (((ulong)pTVar7 & 1) == 0) goto LAB_00507b5f;
        if (((ulong)pTVar7 & (uVar9 | 0x80)) != 0) goto LAB_00507b2f;
        pTVar17 = pTVar7;
        if (((ulong)pTVar7 & 0x20) == 0) {
          pTVar17 = (TranslationBlock *)((ulong)pTVar7 | 0x20);
          x86_stl_phys_notdirty_x86_64(cs,hVar10,(uint)pTVar7 | 0x20);
        }
        uVar15 = (ulong)pTVar17 ^ 0x8000000000000000;
      }
      local_70 = 0;
      hVar10 = get_hphys(cs,((ulong)((uint)((ulong)local_60 >> 0x24) & 0xff8) |
                            (ulong)pTVar17 & 0xffffffffff000) & local_48,MMU_DATA_STORE,(int *)0x0);
      uVar8 = x86_ldq_phys_x86_64(cs,hVar10);
      uVar2 = local_48;
      if ((uVar8 & 1) != 0) {
        if ((uVar8 & (uVar9 | 0x80)) != 0) goto LAB_00507b2f;
        uVar13 = uVar8;
        if ((uVar8 & 0x20) == 0) {
          uVar13 = uVar8 | 0x20;
          x86_stl_phys_notdirty_x86_64(cs,hVar10,(uint)uVar8 | 0x20);
        }
        local_70 = 0;
        local_50 = get_hphys(cs,((ulong)((uint)((ulong)local_60 >> 0x1b) & 0xff8) |
                                uVar13 & 0xffffffffff000) & uVar2,MMU_DATA_STORE,(int *)0x0);
        uVar8 = x86_ldq_phys_x86_64(cs,local_50);
        if (((uVar8 & 1) != 0) && (local_70 = 9, (uVar8 & uVar9) == 0)) {
          uVar16 = uVar8;
          if ((uVar8 & 0x20) == 0) {
            uVar16 = uVar8 | 0x20;
            x86_stl_phys_notdirty_x86_64(cs,local_50,(uint)uVar8 | 0x20);
          }
          uVar15 = (uVar13 ^ 0x8000000000000000) & uVar15 & (uVar8 ^ 0x8000000000000000);
          uVar5 = 0x40000000;
          if ((char)uVar16 < '\0') goto LAB_005078fa;
          goto LAB_005077d5;
        }
      }
    }
LAB_00507b5f:
    error_code = local_70 + 4 + (int)local_40 * 2;
    if (local_54 != 1) {
      error_code = local_70 + (int)local_40 * 2;
    }
    if (local_64 == MMU_INST_FETCH) {
      iVar14 = error_code;
      if (((uint)cs[1].tb_jmp_cache[0x124] >> 0x14 & 1) != 0) {
        iVar14 = error_code + 0x10;
      }
      error_code = error_code + 0x10;
      if (((ulong)cs[1].tb_jmp_cache[0x124] & 0x20) == 0) {
        error_code = iVar14;
      }
      if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x989) & 8) == 0) {
        error_code = iVar14;
      }
    }
  }
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x1cd9) & 0x40) == 0) {
    cs[1].tb_jmp_cache[0x122] = local_60;
  }
  else {
    x86_stq_phys_x86_64(cs,(hwaddr)(cs[1].tb_jmp_cache[0x397]->jmp_list_next + 1),(uint64_t)local_60
                       );
  }
  iVar14 = 0xe;
LAB_00507bdd:
  *(int *)(cs[1].tb_jmp_cache + 0x388) = error_code;
  cs->exception_index = iVar14;
  if ((char)local_34 == '\0') {
    raise_exception_err_ra_x86_64
              ((CPUX86State *)(cs[1].tb_jmp_cache + 0xeb),iVar14,error_code,retaddr);
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/excp_helper.c"
             ,0x2ad,"!probe");
}

Assistant:

bool x86_cpu_tlb_fill(CPUState *cs, vaddr addr, int size,
                      MMUAccessType access_type, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;

    env->retaddr = retaddr;
    if (handle_mmu_fault(cs, addr, size, access_type, mmu_idx)) {
        /* FIXME: On error in get_hphys we have already jumped out.  */
        g_assert(!probe);
        raise_exception_err_ra(env, cs->exception_index,
                               env->error_code, retaddr);
    }
    return true;
}